

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ProceduralBlockSyntax::getChild(ProceduralBlockSyntax *this,size_t index)

{
  Token token;
  long in_RDX;
  long in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  TokenOrSyntax *in_stack_ffffffffffffffb0;
  nullptr_t in_stack_ffffffffffffffb8;
  
  if (in_RDX == 0) {
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x18),in_stack_ffffffffffffffa8);
  }
  else if (in_RDX == 1) {
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffffb8;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffb0,token);
  }
  else if (in_RDX == 2) {
    not_null<slang::syntax::StatementSyntax_*>::get
              ((not_null<slang::syntax::StatementSyntax_*> *)(in_RSI + 0x60));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RDI,in_stack_ffffffffffffffb8);
  }
  return (TokenOrSyntax *)in_RDI;
}

Assistant:

TokenOrSyntax ProceduralBlockSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return statement.get();
        default: return nullptr;
    }
}